

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O1

void __thiscall t_json_generator::generate_service(t_json_generator *this,t_service *tservice)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  pointer pptVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_188;
  vector<t_function_*,_std::allocator<t_function_*>_> local_168;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  start_object(this,true);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"name","");
  get_qualified_name_abi_cxx11_(&local_50,this,&tservice->super_t_type);
  write_key_and_string(this,&local_d0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (tservice->extends_ != (t_service *)0x0) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"extends","");
    get_qualified_name_abi_cxx11_(&local_70,this,&tservice->extends_->super_t_type);
    write_key_and_string(this,&local_f0,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  if ((tservice->super_t_type).super_t_doc.has_doc_ == true) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"doc","");
    pcVar2 = (tservice->super_t_type).super_t_doc.doc_._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar2,
               pcVar2 + (tservice->super_t_type).super_t_doc.doc_._M_string_length);
    write_key_and_string(this,&local_110,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  if ((tservice->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"annotations","");
    write_key_and(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    start_object(this,true);
    p_Var3 = (tservice->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    p_Var1 = &(tservice->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      do {
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,*(long *)(p_Var3 + 1),
                   (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,*(long *)(p_Var3 + 2),
                   (long)&(p_Var3[2]._M_parent)->_M_color + *(long *)(p_Var3 + 2));
        write_key_and_string(this,&local_188,&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
    end_object(this);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"functions","");
  write_key_and(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  start_array(this);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_168,&tservice->functions_)
  ;
  pptVar4 = local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      write_comma_if_needed(this);
      generate_function(this,*pptVar4);
      indicate_comma_needed(this);
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  end_array(this);
  end_object(this);
  if (local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_json_generator::generate_service(t_service* tservice) {
  start_object();

  write_key_and_string("name", get_qualified_name(tservice));

  if (tservice->get_extends()) {
    write_key_and_string("extends", get_qualified_name(tservice->get_extends()));
  }

  if (tservice->has_doc()) {
    write_key_and_string("doc", tservice->get_doc());
  }

  if (tservice->annotations_.size() > 0) {
    write_key_and("annotations");
    start_object();
    for (auto & annotation : tservice->annotations_) {
      write_key_and_string(annotation.first, annotation.second);
    }
    end_object();
  }

  write_key_and("functions");
  start_array();
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator fn_iter = functions.begin();
  for (; fn_iter != functions.end(); fn_iter++) {
    write_comma_if_needed();
    generate_function(*fn_iter);
    indicate_comma_needed();
  }
  end_array();

  end_object();
}